

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  pointer pcVar1;
  Arena *pAVar2;
  FeatureSet *from;
  Arena *pAVar3;
  undefined8 uVar4;
  bool bVar5;
  Nonnull<char_*> pcVar6;
  InternalMetadata arena;
  size_t in_R9;
  string_view format;
  string_view format_00;
  string prefix;
  string formatted_options;
  SourceLocationCommentPrinter comment_printer;
  EnumValueOptions full_options;
  Arena *local_198;
  _func_int **local_190;
  undefined1 local_188 [32];
  atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*> local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 local_140 [120];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  EnumValueOptions local_a8;
  __base_type local_48;
  Nonnull<char_*> local_40;
  
  local_198 = (Arena *)local_188;
  std::__cxx11::string::_M_construct((ulong)&local_198,(char)depth * '\x02');
  local_140._24_8_ = local_140 + 0x28;
  local_140._32_8_ = (__pointer_type)0x0;
  local_140[0x28] = '\0';
  local_140._56_8_ = (long)local_140 + 0x48;
  local_140._64_8_ = 0;
  local_140[0x48] = '\0';
  local_140._88_8_ = (pointer)0x0;
  local_140._96_8_ = (pointer)0x0;
  local_140._104_8_ = (pointer)0x0;
  local_140[0x70] = debug_string_options->include_comments;
  local_140[0x71] = debug_string_options->elide_group_body;
  local_140[0x72] = debug_string_options->elide_oneof_body;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,local_198,(undefined1 *)((long)local_190 + (long)local_198));
  if (debug_string_options->include_comments == true) {
    local_140[0] = GetSourceLocation(this,(SourceLocation *)(local_140 + 8));
  }
  else {
    local_140[0] = false;
  }
  local_188._16_8_ = (ulong)(uint)depth;
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_140,contents);
  pAVar3 = local_198;
  pcVar1 = (this->all_names_->_M_dataplus)._M_p;
  pAVar2 = (Arena *)this->all_names_->_M_string_length;
  pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     (this->number_,(Nonnull<char_*>)&local_160);
  local_188._24_8_ = pcVar6 + -(long)&local_160;
  local_a8.super_Message.super_MessageLite._vptr_MessageLite = local_190;
  local_a8.super_Message.super_MessageLite._internal_metadata_.ptr_ = (intptr_t)pAVar3;
  format._M_str = (char *)&local_a8;
  format._M_len = (size_t)"$0$1 = $2";
  local_168._M_b._M_p = (__base_type)(__base_type)&local_160;
  local_a8.field_0._impl_._extensions_.arena_ = pAVar2;
  local_a8.field_0._8_8_ = pcVar1;
  local_a8.field_0._impl_._extensions_.map_ = (AllocatedData)local_188._24_8_;
  local_a8.field_0._24_8_ = (__pointer_type)&local_160;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)contents,(Nonnull<std::string_*>)0x9,format,
             (Nullable<const_absl::string_view_*>)0x3,in_R9);
  EnumValueOptions::EnumValueOptions(&local_a8,(Arena *)0x0,this->options_);
  uVar4 = local_188._16_8_;
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    local_a8.field_0._24_8_ = local_a8.field_0._24_8_ | 1;
    if (local_a8.field_0._impl_.features_ == (FeatureSet *)0x0) {
      arena.ptr_ = local_a8.super_Message.super_MessageLite._internal_metadata_.ptr_;
      if ((local_a8.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
        arena.ptr_ = *(undefined8 *)
                      (local_a8.super_Message.super_MessageLite._internal_metadata_.ptr_ &
                      0xfffffffffffffffe);
      }
      local_a8.field_0._impl_.features_ =
           (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>((Arena *)arena.ptr_);
    }
    FeatureSet::CopyFrom(local_a8.field_0._impl_.features_,from);
  }
  local_168._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_160 = 0;
  local_188._24_8_ = (__pointer_type)&local_160;
  bVar5 = anon_unknown_24::FormatBracketedOptions
                    ((int)uVar4,&local_a8.super_Message,this->type_->file_->pool_,
                     (string *)(local_188 + 0x18));
  if (bVar5) {
    local_48 = local_168._M_b._M_p;
    local_40 = (Nonnull<char_*>)local_188._24_8_;
    format_00._M_str = (char *)&local_48;
    format_00._M_len = (size_t)" [$0]";
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)contents,(Nonnull<std::string_*>)0x5,format_00,
               (Nullable<const_absl::string_view_*>)0x1,in_R9);
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_140,contents);
  if ((__pointer_type)local_188._24_8_ != (__pointer_type)&local_160) {
    operator_delete((void *)local_188._24_8_,CONCAT71(uStack_15f,local_160) + 1);
  }
  EnumValueOptions::~EnumValueOptions(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_140 + 0x58));
  if (local_140._56_8_ != (long)local_140 + 0x48U) {
    operator_delete((void *)local_140._56_8_,CONCAT71(local_140._73_7_,local_140[0x48]) + 1);
  }
  if ((undefined1 *)local_140._24_8_ != local_140 + 0x28) {
    operator_delete((void *)local_140._24_8_,CONCAT71(local_140._41_7_,local_140[0x28]) + 1);
  }
  if (local_198 != (Arena *)local_188) {
    operator_delete(local_198,local_188._0_8_ + 1);
  }
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1 = $2", prefix, name(), number());

  EnumValueOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, type()->file()->pool(),
                             &formatted_options)) {
    absl::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}